

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

bool __thiscall wasm::Literal::isNaN(Literal *this)

{
  bool bVar1;
  uintptr_t uVar2;
  float fVar3;
  double dVar4;
  
  uVar2 = (this->type).id;
  if (uVar2 == 4) {
    fVar3 = getf32(this);
    if (!NAN(fVar3)) {
      uVar2 = (this->type).id;
      goto LAB_00c9402c;
    }
LAB_00c94049:
    bVar1 = true;
  }
  else {
LAB_00c9402c:
    if (uVar2 == 5) {
      dVar4 = getf64(this);
      if (NAN(dVar4)) goto LAB_00c94049;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Literal::isNaN() {
  if (type == Type::f32 && std::isnan(getf32())) {
    return true;
  }
  if (type == Type::f64 && std::isnan(getf64())) {
    return true;
  }
  // TODO: SIMD?
  return false;
}